

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

GLXContext createLegacyContext(_GLFWwindow *window,GLXFBConfig fbconfig,GLXContext share)

{
  GLXContext p_Var1;
  
  if (_glfw.glx.SGIX_fbconfig != '\0') {
    p_Var1 = (*_glfw.glx.CreateContextWithConfigSGIX)
                       (_glfw.x11.display,(GLXFBConfigSGIX)window,0x8014,(GLXContext)fbconfig,1);
    return p_Var1;
  }
  p_Var1 = (GLXContext)glXCreateNewContext(_glfw.x11.display,window,0x8014,fbconfig,1);
  return p_Var1;
}

Assistant:

static GLXContext createLegacyContext(_GLFWwindow* window,
                                      GLXFBConfig fbconfig,
                                      GLXContext share)
{
    if (_glfw.glx.SGIX_fbconfig)
    {
        return _glfw.glx.CreateContextWithConfigSGIX(_glfw.x11.display,
                                                     fbconfig,
                                                     GLX_RGBA_TYPE,
                                                     share,
                                                     True);
    }

    return glXCreateNewContext(_glfw.x11.display,
                               fbconfig,
                               GLX_RGBA_TYPE,
                               share,
                               True);
}